

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem_capi.cpp
# Opt level: O3

void __thiscall rlottie::internal::renderer::SolidLayer::buildLayerNode(SolidLayer *this)

{
  pointer *pppLVar1;
  CApiData *pCVar2;
  pointer ppLVar3;
  Drawable *this_00;
  iterator __position;
  LOTNode *in_RAX;
  long lVar4;
  DrawableList DVar5;
  _Head_base<0UL,_LOTNode_*,_false> local_38;
  
  local_38._M_head_impl = in_RAX;
  Layer::buildLayerNode(&this->super_Layer);
  DVar5 = renderList(this);
  pCVar2 = (this->super_Layer).mCApiData._M_t.
           super___uniq_ptr_impl<rlottie::internal::renderer::CApiData,_std::default_delete<rlottie::internal::renderer::CApiData>_>
           ._M_t.
           super__Tuple_impl<0UL,_rlottie::internal::renderer::CApiData_*,_std::default_delete<rlottie::internal::renderer::CApiData>_>
           .super__Head_base<0UL,_rlottie::internal::renderer::CApiData_*,_false>._M_head_impl;
  ppLVar3 = *(pointer *)
             &(pCVar2->mCNodeList).super__Vector_base<LOTNode_*,_std::allocator<LOTNode_*>_>._M_impl
  ;
  if (*(pointer *)
       ((long)&(pCVar2->mCNodeList).super__Vector_base<LOTNode_*,_std::allocator<LOTNode_*>_> + 8)
      != ppLVar3) {
    *(pointer *)
     ((long)&(pCVar2->mCNodeList).super__Vector_base<LOTNode_*,_std::allocator<LOTNode_*>_> + 8) =
         ppLVar3;
  }
  if (DVar5._size != 0) {
    lVar4 = 0;
    do {
      this_00 = *(Drawable **)((long)DVar5._data + lVar4);
      Drawable::sync(this_00);
      pCVar2 = (this->super_Layer).mCApiData._M_t.
               super___uniq_ptr_impl<rlottie::internal::renderer::CApiData,_std::default_delete<rlottie::internal::renderer::CApiData>_>
               ._M_t.
               super__Tuple_impl<0UL,_rlottie::internal::renderer::CApiData_*,_std::default_delete<rlottie::internal::renderer::CApiData>_>
               .super__Head_base<0UL,_rlottie::internal::renderer::CApiData_*,_false>._M_head_impl;
      local_38._M_head_impl =
           (this_00->mCNode)._M_t.super___uniq_ptr_impl<LOTNode,_std::default_delete<LOTNode>_>._M_t
           .super__Tuple_impl<0UL,_LOTNode_*,_std::default_delete<LOTNode>_>.
           super__Head_base<0UL,_LOTNode_*,_false>._M_head_impl;
      __position._M_current =
           *(pointer *)
            ((long)&(pCVar2->mCNodeList).super__Vector_base<LOTNode_*,_std::allocator<LOTNode_*>_> +
            8);
      if (__position._M_current ==
          *(pointer *)
           ((long)&(pCVar2->mCNodeList).super__Vector_base<LOTNode_*,_std::allocator<LOTNode_*>_> +
           0x10)) {
        std::vector<LOTNode*,std::allocator<LOTNode*>>::_M_realloc_insert<LOTNode*>
                  ((vector<LOTNode*,std::allocator<LOTNode*>> *)&pCVar2->mCNodeList,__position,
                   &local_38._M_head_impl);
      }
      else {
        *__position._M_current = local_38._M_head_impl;
        pppLVar1 = (pointer *)
                   ((long)&(pCVar2->mCNodeList).
                           super__Vector_base<LOTNode_*,_std::allocator<LOTNode_*>_> + 8);
        *pppLVar1 = *pppLVar1 + 1;
      }
      lVar4 = lVar4 + 8;
    } while (DVar5._size << 3 != lVar4);
  }
  pCVar2 = (this->super_Layer).mCApiData._M_t.
           super___uniq_ptr_impl<rlottie::internal::renderer::CApiData,_std::default_delete<rlottie::internal::renderer::CApiData>_>
           ._M_t.
           super__Tuple_impl<0UL,_rlottie::internal::renderer::CApiData_*,_std::default_delete<rlottie::internal::renderer::CApiData>_>
           .super__Head_base<0UL,_rlottie::internal::renderer::CApiData_*,_false>._M_head_impl;
  (pCVar2->mLayer).mNodeList.ptr =
       *(LOTNode ***)
        &(pCVar2->mCNodeList).super__Vector_base<LOTNode_*,_std::allocator<LOTNode_*>_>._M_impl;
  pCVar2 = (this->super_Layer).mCApiData._M_t.
           super___uniq_ptr_impl<rlottie::internal::renderer::CApiData,_std::default_delete<rlottie::internal::renderer::CApiData>_>
           ._M_t.
           super__Tuple_impl<0UL,_rlottie::internal::renderer::CApiData_*,_std::default_delete<rlottie::internal::renderer::CApiData>_>
           .super__Head_base<0UL,_rlottie::internal::renderer::CApiData_*,_false>._M_head_impl;
  *(long *)((long)&(pCVar2->mLayer).mNodeList + 8) =
       (long)*(pointer *)
              ((long)&(pCVar2->mCNodeList).super__Vector_base<LOTNode_*,_std::allocator<LOTNode_*>_>
              + 8) -
       *(long *)&(pCVar2->mCNodeList).super__Vector_base<LOTNode_*,_std::allocator<LOTNode_*>_>.
                 _M_impl >> 3;
  return;
}

Assistant:

void renderer::SolidLayer::buildLayerNode()
{
    renderer::Layer::buildLayerNode();

    auto renderlist = renderList();

    cnodes().clear();
    for (auto &i : renderlist) {
        auto lotDrawable = static_cast<renderer::Drawable *>(i);
        lotDrawable->sync();
        cnodes().push_back(lotDrawable->mCNode.get());
    }
    clayer().mNodeList.ptr = cnodes().data();
    clayer().mNodeList.size = cnodes().size();
}